

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitExpr
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,AssignmentExpression *expr)

{
  bool bVar1;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_RSI;
  Expression *in_RDI;
  AssignmentExpression *unaff_retaddr;
  
  ast::AssignmentExpression::left((AssignmentExpression *)in_RSI);
  visit<slang::ast::Expression>(in_RSI,in_RDI);
  bVar1 = ast::AssignmentExpression::isLValueArg(unaff_retaddr);
  if (!bVar1) {
    ast::AssignmentExpression::right((AssignmentExpression *)in_RSI);
    visit<slang::ast::Expression>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void visitExpr(const AssignmentExpression& expr) {
        // Of note, if this is a nonblocking assignment we
        // still visit the left and right sides now, but the
        // actual assignment won't happen immediately.
        visit(expr.left());
        if (!expr.isLValueArg())
            visit(expr.right());
    }